

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-pending-instances.c
# Opt level: O0

int run_test_pipe_pending_instances(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t *loop;
  uv_pipe_t pipe_handle;
  int r;
  
  loop_00 = uv_default_loop();
  pipe_handle.pipe_fname._4_4_ = uv_pipe_init(loop_00,(uv_pipe_t *)&loop,0);
  if ((long)pipe_handle.pipe_fname._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-pending-instances.c"
            ,0x28,"r","==","0",(long)pipe_handle.pipe_fname._4_4_,"==",0);
    abort();
  }
  uv_pipe_pending_instances((uv_pipe_t *)&loop,8);
  pipe_handle.pipe_fname._4_4_ = uv_pipe_bind((uv_pipe_t *)&loop,"/tmp/uv-test-sock");
  if ((long)pipe_handle.pipe_fname._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-pending-instances.c"
            ,0x2d,"r","==","0",(long)pipe_handle.pipe_fname._4_4_,"==",0);
    abort();
  }
  uv_pipe_pending_instances((uv_pipe_t *)&loop,0x10);
  pipe_handle.pipe_fname._4_4_ = uv_listen((uv_stream_t *)&loop,0x80,connection_cb);
  if ((long)pipe_handle.pipe_fname._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-pending-instances.c"
            ,0x32,"r","==","0",(long)pipe_handle.pipe_fname._4_4_,"==",0);
    abort();
  }
  uv_close((uv_handle_t *)&loop,(uv_close_cb)0x0);
  pipe_handle.pipe_fname._4_4_ = uv_run(loop_00,UV_RUN_DEFAULT);
  if ((long)pipe_handle.pipe_fname._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-pending-instances.c"
            ,0x37,"r","==","0",(long)pipe_handle.pipe_fname._4_4_,"==",0);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-pending-instances.c"
            ,0x39,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(pipe_pending_instances) {
  int r;
  uv_pipe_t pipe_handle;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &pipe_handle, 0);
  ASSERT_OK(r);

  uv_pipe_pending_instances(&pipe_handle, 8);

  r = uv_pipe_bind(&pipe_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  uv_pipe_pending_instances(&pipe_handle, 16);

  r = uv_listen((uv_stream_t*)&pipe_handle, 128, connection_cb);
  ASSERT_OK(r);

  uv_close((uv_handle_t*)&pipe_handle, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}